

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileperblock_file.cpp
# Opt level: O1

void __thiscall
foxxll::fileperblock_file<foxxll::mmap_file>::lock(fileperblock_file<foxxll::mmap_file> *this)

{
  lock((fileperblock_file<foxxll::mmap_file> *)
       ((long)&(this->super_disk_queued_file)._vptr_disk_queued_file +
       (long)(this->super_disk_queued_file)._vptr_disk_queued_file[-10]));
  return;
}

Assistant:

void fileperblock_file<base_file_type>::lock()
{
    if (!lock_file_)
    {
        lock_file_ = tlx::make_counting<base_file_type>(
                filename_prefix_ + "_fpb_lock", mode_, get_queue_id()
            );

        //create lock file and fill it with one page, an empty file cannot be locked
        const int page_size = BlockAlignment;
        void* one_page = aligned_alloc<BlockAlignment>(page_size);
#if FOXXLL_WITH_VALGRIND
        memset(one_page, 0, page_size);
#endif
        lock_file_->set_size(page_size);
        request_ptr r = lock_file_->awrite(one_page, 0, page_size);
        r->wait();
        aligned_dealloc<BlockAlignment>(one_page);
    }
    lock_file_->lock();
}